

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactorRational::factor(CLUFactorRational *this,SVectorRational **vec,Rational *threshold)

{
  Status SVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  
  (*this->factorTime->_vptr_Timer[3])();
  this->stat = OK;
  *(this->l).start = 0;
  (this->l).firstUpdate = 0;
  (this->l).firstUnused = 0;
  iVar6 = this->thedim;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&(this->temp).s_max,iVar6,true);
  spx_realloc<int*>(&(this->temp).s_cact,iVar6);
  spx_realloc<int*>(&(this->temp).s_mark,iVar6);
  (this->temp).stage = 0;
  if (0 < this->thedim) {
    piVar2 = (this->col).perm;
    piVar3 = (this->col).orig;
    piVar4 = (this->row).orig;
    piVar5 = (this->row).perm;
    lVar7 = 0;
    do {
      piVar2[lVar7] = -1;
      piVar3[lVar7] = -1;
      piVar5[lVar7] = -1;
      piVar4[lVar7] = -1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->thedim);
  }
  initFactorMatrix(this,vec);
  if (this->stat == OK) {
    if ((this->timeLimit < 0.0) ||
       ((*this->factorTime->_vptr_Timer[6])(), extraout_XMM0_Qa < this->timeLimit)) {
      colSingletons(this);
      if (this->stat == OK) {
        if ((0.0 <= this->timeLimit) &&
           ((*this->factorTime->_vptr_Timer[6])(), this->timeLimit <= extraout_XMM0_Qa_00))
        goto LAB_001af2ee;
        rowSingletons(this);
        if (this->stat == OK) {
          if ((this->temp).stage < this->thedim) {
            if ((0.0 <= this->timeLimit) &&
               ((*this->factorTime->_vptr_Timer[6])(), this->timeLimit <= extraout_XMM0_Qa_01))
            goto LAB_001af2ee;
            initFactorRings(this);
            eliminateNucleus(this,threshold);
            freeFactorRings(this);
            SVar1 = this->stat;
            (this->l).firstUpdate = (this->l).firstUnused;
            if (SVar1 != OK) goto LAB_001af300;
          }
          else {
            (this->l).firstUpdate = (this->l).firstUnused;
          }
          setupRowVals(this);
          iVar6 = setupColVals(this);
          this->nzCnt = iVar6;
          goto LAB_001af300;
        }
      }
    }
    else {
LAB_001af2ee:
      this->stat = TIME;
    }
  }
  (this->l).firstUpdate = (this->l).firstUnused;
LAB_001af300:
  (*this->factorTime->_vptr_Timer[4])();
  this->factorCount = this->factorCount + 1;
  return;
}

Assistant:

inline void CLUFactorRational::factor(
   const SVectorRational** vec,         ///< Array of column vector pointers
   const Rational& threshold            ///< pivoting threshold
)
{
   SPxOut::debug(this, "CLUFactorRational::factor()\n");

   factorTime->start();

   stat = SLinSolverRational::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec);

   if(stat)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   rowSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      if(timeLimitReached())
         goto TERMINATE;

      initFactorRings();
      eliminateNucleus(threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(stat == SLinSolverRational::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}